

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
::InitNonPeriodic(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
                  *this)

{
  const_iterator __first;
  const_iterator __first_00;
  _Rb_tree_const_iterator<float> __last;
  _Rb_tree_const_iterator<float> __first_01;
  iterator this_00;
  undefined1 uVar1;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<float>,_bool> pVar2;
  _Rb_tree_const_iterator<float> it;
  set<float,_std::less<float>,_std::allocator<float>_> bpl_set;
  BreakpointList bp_default;
  set<float,_std::less<float>,_std::allocator<float>_> *in_stack_fffffffffffffe98;
  set<float,_std::less<float>,_std::allocator<float>_> *psVar3;
  _Rb_tree_const_iterator<float> *in_stack_fffffffffffffea0;
  set<float,_std::less<float>,_std::allocator<float>_> *in_stack_fffffffffffffea8;
  const_iterator in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  set<float,_std::less<float>,_std::allocator<float>_> *in_stack_fffffffffffffec0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed0;
  set<float,_std::less<float>,_std::allocator<float>_> local_50;
  
  in_RDI->laPrm_->fUsePeriod = false;
  (*in_RDI->_vptr_BasicPLApproximator[8])();
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98);
  std::set<float,std::less<float>,std::allocator<float>>::
  set<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  lbx(in_RDI);
  std::set<float,_std::less<float>,_std::allocator<float>_>::insert
            (in_stack_fffffffffffffec0,
             (value_type_conflict7 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::set<float,_std::less<float>,_std::allocator<float>_>::begin(in_stack_fffffffffffffe98);
  __first._M_node._7_1_ = in_stack_fffffffffffffebf;
  __first._M_node._0_7_ = in_stack_fffffffffffffeb8;
  std::set<float,std::less<float>,std::allocator<float>>::erase_abi_cxx11_
            (in_stack_fffffffffffffea8,__first,in_stack_fffffffffffffeb0);
  ubx(in_RDI);
  pVar2 = std::set<float,_std::less<float>,_std::allocator<float>_>::insert
                    (in_stack_fffffffffffffec0,
                     (value_type_conflict7 *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  __first_01 = pVar2.first._M_node;
  uVar1 = pVar2.second;
  std::_Rb_tree_const_iterator<float>::operator++(in_stack_fffffffffffffea0);
  psVar3 = &local_50;
  std::set<float,_std::less<float>,_std::allocator<float>_>::end(in_stack_fffffffffffffe98);
  __first_00._M_node._7_1_ = uVar1;
  __first_00._M_node._0_7_ = in_stack_fffffffffffffeb8;
  this_00 = std::set<float,std::less<float>,std::allocator<float>>::erase_abi_cxx11_
                      (psVar3,__first_00,in_stack_fffffffffffffeb0);
  psVar3 = &local_50;
  std::set<float,_std::less<float>,_std::allocator<float>_>::begin(psVar3);
  std::set<float,_std::less<float>,_std::allocator<float>_>::end(psVar3);
  __last._M_node._7_1_ = uVar1;
  __last._M_node._0_7_ = in_stack_fffffffffffffeb8;
  std::vector<double,std::allocator<double>>::assign<std::_Rb_tree_const_iterator<float>,void>
            ((vector<double,_std::allocator<double>_> *)this_00._M_node,__first_01,__last);
  std::set<float,_std::less<float>,_std::allocator<float>_>::~set
            ((set<float,_std::less<float>,_std::allocator<float>_> *)0x52fa6e);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00._M_node);
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::InitNonPeriodic() {
  // If using breakpoints, need to narrow / exclude subinterval
  // according to lbx() / ubx()
  laPrm_.fUsePeriod = false;
  auto bp_default = GetDefaultBreakpoints();
  std::set<float> bpl_set(bp_default.begin(), bp_default.end());
  auto it = bpl_set.insert(lbx()).first;
  bpl_set.erase(bpl_set.begin(), it);      // remove points before lbx()
  it = bpl_set.insert(ubx()).first;
  bpl_set.erase(++it, bpl_set.end());      // remove points after ubx()
  breakpoints_.assign(bpl_set.begin(), bpl_set.end());
  assert(breakpoints_.size() >= 2);
}